

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZSkylineNSymStructMatrix.cpp
# Opt level: O3

void __thiscall
TPZSkylineNSymStructMatrix<double,_TPZStructMatrixOR<double>_>::TPZSkylineNSymStructMatrix
          (TPZSkylineNSymStructMatrix<double,_TPZStructMatrixOR<double>_> *this,
          TPZAutoPointer<TPZCompMesh> *cmesh)

{
  TPZAutoPointer<TPZCompMesh> local_20;
  
  *(undefined8 *)
   &(this->super_TPZSkylineStructMatrix<double,_TPZStructMatrixOR<double>_>).field_0xe8 = 0x1968b20;
  *(undefined8 *)
   &(this->super_TPZSkylineStructMatrix<double,_TPZStructMatrixOR<double>_>).
    super_TPZStructMatrixT<double>.super_TPZStructMatrix = 0x1968be8;
  *(undefined4 *)
   &(this->super_TPZSkylineStructMatrix<double,_TPZStructMatrixOR<double>_>).field_0xf0 = 0;
  (this->super_TPZSkylineStructMatrix<double,_TPZStructMatrixOR<double>_>).field_0xf4 = 1;
  local_20 = (TPZAutoPointer<TPZCompMesh>)cmesh->fRef;
  LOCK();
  ((local_20.fRef)->fCounter).super___atomic_base<int>._M_i =
       ((local_20.fRef)->fCounter).super___atomic_base<int>._M_i + 1;
  UNLOCK();
  TPZStructMatrix::TPZStructMatrix
            ((TPZStructMatrix *)this,&PTR_construction_vtable_104__01968188,&local_20);
  *(undefined8 *)
   &(this->super_TPZSkylineStructMatrix<double,_TPZStructMatrixOR<double>_>).field_0xe8 = 0x19685f8;
  *(undefined8 *)
   &(this->super_TPZSkylineStructMatrix<double,_TPZStructMatrixOR<double>_>).
    super_TPZStructMatrixT<double>.super_TPZStructMatrix = 0x1968518;
  TPZStructMatrixOR<double>::TPZStructMatrixOR
            ((TPZStructMatrixOR<double> *)
             &(this->super_TPZSkylineStructMatrix<double,_TPZStructMatrixOR<double>_>).
              super_TPZStructMatrixT<double>.super_TPZStructMatrix.field_0xa0,
             &PTR_construction_vtable_104__019681b0);
  *(undefined8 *)
   &(this->super_TPZSkylineStructMatrix<double,_TPZStructMatrixOR<double>_>).field_0xe8 = 0x1968440;
  *(undefined8 *)
   &(this->super_TPZSkylineStructMatrix<double,_TPZStructMatrixOR<double>_>).
    super_TPZStructMatrixT<double>.super_TPZStructMatrix = 0x1968278;
  *(undefined8 *)
   &(this->super_TPZSkylineStructMatrix<double,_TPZStructMatrixOR<double>_>).
    super_TPZStructMatrixT<double>.super_TPZStructMatrix.field_0xa0 = 0x1968340;
  *(undefined ***)
   &(this->super_TPZSkylineStructMatrix<double,_TPZStructMatrixOR<double>_>).
    super_TPZStructMatrixT<double>.super_TPZStructMatrix.field_0xa8 = &PTR__TPZVec_01813f30;
  *(undefined8 *)
   &(this->super_TPZSkylineStructMatrix<double,_TPZStructMatrixOR<double>_>).field_0xb0 = 0;
  *(undefined8 *)
   &(this->super_TPZSkylineStructMatrix<double,_TPZStructMatrixOR<double>_>).field_0xb8 = 0;
  *(undefined8 *)
   &(this->super_TPZSkylineStructMatrix<double,_TPZStructMatrixOR<double>_>).field_0xc0 = 0;
  (this->super_TPZSkylineStructMatrix<double,_TPZStructMatrixOR<double>_>).fEquationDestination.
  _vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813f30;
  (this->super_TPZSkylineStructMatrix<double,_TPZStructMatrixOR<double>_>).fEquationDestination.
  fStore = (long *)0x0;
  (this->super_TPZSkylineStructMatrix<double,_TPZStructMatrixOR<double>_>).fEquationDestination.
  fNElements = 0;
  (this->super_TPZSkylineStructMatrix<double,_TPZStructMatrixOR<double>_>).fEquationDestination.
  fNAlloc = 0;
  TPZAutoPointer<TPZCompMesh>::~TPZAutoPointer(&local_20);
  *(undefined8 *)
   &(this->super_TPZSkylineStructMatrix<double,_TPZStructMatrixOR<double>_>).field_0xe8 = 0x1968100;
  *(undefined8 *)
   &(this->super_TPZSkylineStructMatrix<double,_TPZStructMatrixOR<double>_>).
    super_TPZStructMatrixT<double>.super_TPZStructMatrix = 0x1967f38;
  *(undefined8 *)
   &(this->super_TPZSkylineStructMatrix<double,_TPZStructMatrixOR<double>_>).
    super_TPZStructMatrixT<double>.super_TPZStructMatrix.field_0xa0 = 0x1968000;
  return;
}

Assistant:

TPZSkylineNSymStructMatrix<TVar,TPar>::TPZSkylineNSymStructMatrix(TPZAutoPointer<TPZCompMesh> cmesh)
  : TPZSkylineStructMatrix<TVar,TPar>(cmesh)
{
  ///nothing here
}